

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

Symbol * __thiscall Parse::SMTLIB2::getSymbol(SMTLIB2 *this,DeclaredSymbol *s)

{
  int iVar1;
  long in_RSI;
  Symbol *sym;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  local_18 = (Symbol *)0x0;
  iVar1 = *(int *)(in_RSI + 4);
  if (iVar1 == 0) {
    local_18 = Kernel::Signature::getFunction
                         ((Signature *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  else if (iVar1 == 1) {
    local_18 = Kernel::Signature::getPredicate
                         ((Signature *)CONCAT44(1,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
  }
  else if (iVar1 == 2) {
    local_18 = Kernel::Signature::getTypeCon
                         ((Signature *)CONCAT44(2,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
  }
  return local_18;
}

Assistant:

Signature::Symbol* SMTLIB2::getSymbol(DeclaredSymbol& s) {
  Signature::Symbol* sym = nullptr;
  switch (s.second)
  {
  case SymbolType::FUNCTION: {
    sym = env.signature->getFunction(s.first);
    break;
  }
  case SymbolType::PREDICATE: {
    sym = env.signature->getPredicate(s.first);
    break;
  }
  case SymbolType::TYPECON: {
    sym = env.signature->getTypeCon(s.first);
    break;
  }
  }

  return sym;
}